

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSizeTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeSizeCase::iterate(TextureCubeSizeCase *this)

{
  bool bVar1;
  int iVar2;
  IterateResult IVar3;
  char *description;
  
  bVar1 = testFace(this,this->m_curFace);
  if (!bVar1) {
    this->m_isOk = false;
  }
  iVar2 = this->m_curFace + 1;
  this->m_curFace = iVar2;
  if (iVar2 == 6) {
    description = "Image comparison failed";
    if (this->m_isOk != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,this->m_isOk ^ QP_TEST_RESULT_FAIL,
               description);
    IVar3 = STOP;
  }
  else {
    IVar3 = CONTINUE;
  }
  return IVar3;
}

Assistant:

TextureCubeSizeCase::IterateResult TextureCubeSizeCase::iterate (void)
{
	// Execute test for all faces.
	if (!testFace((tcu::CubeFace)m_curFace))
		m_isOk = false;

	m_curFace += 1;

	if (m_curFace == tcu::CUBEFACE_LAST)
	{
		m_testCtx.setTestResult(m_isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								m_isOk ? "Pass"					: "Image comparison failed");
		return STOP;
	}
	else
		return CONTINUE;
}